

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcParser.h
# Opt level: O2

void __thiscall Calc::CalcParser::Evaluate(CalcParser *this,istream *stream)

{
  pointer pfVar1;
  bool bVar2;
  runtime_error *this_00;
  undefined1 local_1d8 [8];
  Parse<SGParser::ParseStackGenericElement> parser;
  DFATokenizer<SGParser::GenericToken> tokenizer;
  StdStreamAdapter input;
  
  tokenizer.ExpressionStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&PTR__InputStream_0010fc78;
  SGParser::DFATokenizer<SGParser::GenericToken>::DFATokenizer
            ((DFATokenizer<SGParser::GenericToken> *)((long)&parser.ErrorStackStr.field_2 + 8),
             &this->automata,
             (InputStream *)
             &tokenizer.ExpressionStack.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  SGParser::Parse<SGParser::ParseStackGenericElement>::Parse
            ((Parse<SGParser::ParseStackGenericElement> *)local_1d8,(ParseTable *)0x0,0x800);
  bVar2 = SGParser::Parse<SGParser::ParseStackGenericElement>::Create
                    ((Parse<SGParser::ParseStackGenericElement> *)local_1d8,&this->table,
                     (TokenStream<SGParser::GenericToken> *)
                     ((long)&parser.ErrorStackStr.field_2 + 8),0x800);
  if (bVar2) {
    pfVar1 = (this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (this->numbers).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    SGParser::Parse<SGParser::ParseStackGenericElement>::DoParse
              ((Parse<SGParser::ParseStackGenericElement> *)local_1d8,
               &this->super_ParseHandler<SGParser::ParseStackGenericElement>);
    SGParser::Parse<SGParser::ParseStackGenericElement>::~Parse
              ((Parse<SGParser::ParseStackGenericElement> *)local_1d8);
    SGParser::DFATokenizer<SGParser::GenericToken>::~DFATokenizer
              ((DFATokenizer<SGParser::GenericToken> *)((long)&parser.ErrorStackStr.field_2 + 8));
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"failed to create parser");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Evaluate(std::istream& stream) {
        StdStreamAdapter                input{stream};
        DFATokenizer<GenericToken>      tokenizer{&automata, &input};
        Parse<ParseStackGenericElement> parser;
        
        if (parser.Create(&table, &tokenizer) == false)
            throw std::runtime_error("failed to create parser");

        numbers.clear();

        parser.DoParse(*this);
    }